

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

int __thiscall raspicam::_private::Private_Impl_Still::createEncoder(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  MMAL_FOURCC_T MVar2;
  ostream *poVar3;
  MMAL_POOL_T *pMVar4;
  Private_Impl_Still *in_RDI;
  Private_Impl_Still *this_00;
  int local_4;
  
  this_00 = in_RDI;
  MVar1 = mmal_component_create("vc.ril.image_encode",&in_RDI->encoder);
  if (MVar1 == MMAL_SUCCESS) {
    if ((in_RDI->encoder->input_num == 0) || (in_RDI->encoder->output_num == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
      std::operator<<(poVar3,": Encoder does not have input/output ports.\n");
      destroyEncoder(this_00);
      local_4 = -1;
    }
    else {
      in_RDI->encoder_input_port = *in_RDI->encoder->input;
      in_RDI->encoder_output_port = *in_RDI->encoder->output;
      mmal_format_copy(in_RDI->encoder_output_port->format,in_RDI->encoder_input_port->format);
      MVar2 = convertEncoding(in_RDI,in_RDI->encoding);
      in_RDI->encoder_output_port->format->encoding = MVar2;
      in_RDI->encoder_output_port->buffer_size =
           in_RDI->encoder_output_port->buffer_size_recommended;
      if (in_RDI->encoder_output_port->buffer_size < in_RDI->encoder_output_port->buffer_size_min) {
        in_RDI->encoder_output_port->buffer_size = in_RDI->encoder_output_port->buffer_size_min;
      }
      in_RDI->encoder_output_port->buffer_num = in_RDI->encoder_output_port->buffer_num_recommended;
      if (in_RDI->encoder_output_port->buffer_num < in_RDI->encoder_output_port->buffer_num_min) {
        in_RDI->encoder_output_port->buffer_num = in_RDI->encoder_output_port->buffer_num_min;
      }
      MVar1 = mmal_port_format_commit(in_RDI->encoder_output_port);
      if (MVar1 == MMAL_SUCCESS) {
        MVar1 = mmal_component_enable(in_RDI->encoder);
        if (MVar1 == MMAL_SUCCESS) {
          pMVar4 = mmal_port_pool_create
                             (in_RDI->encoder_output_port,in_RDI->encoder_output_port->buffer_num,
                              in_RDI->encoder_output_port->buffer_size);
          in_RDI->encoder_pool = pMVar4;
          if (pMVar4 == (MMAL_POOL_T *)0x0) {
            poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
            std::operator<<(poVar3,
                            ": Failed to create buffer header pool for encoder output port.\n");
            destroyEncoder(this_00);
            local_4 = -1;
          }
          else {
            local_4 = 0;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
          std::operator<<(poVar3,": Could not enable encoder component.\n");
          destroyEncoder(this_00);
          local_4 = -1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
        std::operator<<(poVar3,": Could not set format on encoder output port.\n");
        destroyEncoder(this_00);
        local_4 = -1;
      }
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
    std::operator<<(poVar3,": Could not create encoder component.\n");
    destroyEncoder(this_00);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Private_Impl_Still::createEncoder() {
            if ( mmal_component_create ( MMAL_COMPONENT_DEFAULT_IMAGE_ENCODER, &encoder ) ) {
                cout << API_NAME << ": Could not create encoder component.\n";
                destroyEncoder();
                return -1;
            }
            if ( !encoder->input_num || !encoder->output_num ) {
                cout << API_NAME << ": Encoder does not have input/output ports.\n";
                destroyEncoder();
                return -1;
            }

            encoder_input_port = encoder->input[0];
            encoder_output_port = encoder->output[0];

            mmal_format_copy ( encoder_output_port->format, encoder_input_port->format );
            encoder_output_port->format->encoding = convertEncoding ( encoding ); // Set output encoding
            encoder_output_port->buffer_size = encoder_output_port->buffer_size_recommended;
            if ( encoder_output_port->buffer_size < encoder_output_port->buffer_size_min )
                encoder_output_port->buffer_size = encoder_output_port->buffer_size_min;
            encoder_output_port->buffer_num = encoder_output_port->buffer_num_recommended;
            if ( encoder_output_port->buffer_num < encoder_output_port->buffer_num_min )
                encoder_output_port->buffer_num = encoder_output_port->buffer_num_min;

            if ( mmal_port_format_commit ( encoder_output_port ) ) {
                cout << API_NAME << ": Could not set format on encoder output port.\n";
                destroyEncoder();
                return -1;
            }
            if ( mmal_component_enable ( encoder ) ) {
                cout << API_NAME << ": Could not enable encoder component.\n";
                destroyEncoder();
                return -1;
            }
            if ( ! ( encoder_pool = mmal_port_pool_create ( encoder_output_port, encoder_output_port->buffer_num, encoder_output_port->buffer_size ) ) ) {
                cout << API_NAME << ": Failed to create buffer header pool for encoder output port.\n";
                destroyEncoder();
                return -1;
            }
            return 0;
        }